

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

long remove_unreachable_bbs(gen_ctx_t gen_ctx)

{
  bitmap_t pVVar1;
  VARR_bb_t *pVVar2;
  ulong uVar3;
  int iVar4;
  bb_t_conflict *ppbVar5;
  long lVar6;
  bb_t pbVar7;
  long extraout_RAX;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  bb_t_conflict pbVar11;
  bb_t_conflict bb;
  size_t sVar12;
  long lVar13;
  out_edge_t peVar14;
  bool bVar15;
  size_t sStack_38;
  code *pcStack_30;
  
  pbVar11 = (gen_ctx->curr_cfg->bbs).head;
  if (pbVar11 == (bb_t_conflict)0x0) {
    return 0;
  }
  pbVar7 = pbVar11;
  iVar4 = -1;
  do {
    pbVar7 = (pbVar7->bb_link).next;
    if (pbVar7 == (bb_t)0x0) break;
    bVar15 = iVar4 != 0;
    iVar4 = iVar4 + 1;
  } while (bVar15);
  if (pbVar7 == (bb_t)0x0) {
LAB_0015f3f4:
    if (pbVar11 == (bb_t_conflict)0x0) {
      return 0;
    }
    iVar4 = -1;
    do {
      pbVar11 = (pbVar11->bb_link).next;
      if (pbVar11 == (bb_t_conflict)0x0) break;
      bVar15 = iVar4 != 0;
      iVar4 = iVar4 + 1;
    } while (bVar15);
    if (pbVar11 == (bb_t_conflict)0x0) {
      return 0;
    }
    lVar13 = 0;
    while (pVVar1 = gen_ctx->temp_bitmap, pVVar1 != (bitmap_t)0x0) {
      uVar9 = pbVar11->index;
      pbVar7 = (pbVar11->bb_link).next;
      if ((pVVar1->els_num << 6 <= uVar9) || ((pVVar1->varr[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0)
         ) {
        pcStack_30 = (code *)0x15f451;
        lVar6 = remove_bb(gen_ctx,pbVar11);
        lVar13 = lVar13 + lVar6;
      }
      pbVar11 = pbVar7;
      if (pbVar7 == (bb_t)0x0) {
        return lVar13;
      }
    }
LAB_0015f482:
    pcStack_30 = (code *)0x15f487;
    remove_unreachable_bbs_cold_10();
LAB_0015f487:
    pcStack_30 = (code *)0x15f48c;
    remove_unreachable_bbs_cold_2();
LAB_0015f48c:
    pcStack_30 = (code *)0x15f491;
    remove_unreachable_bbs_cold_1();
LAB_0015f491:
    pcStack_30 = (code *)0x15f496;
    remove_unreachable_bbs_cold_9();
  }
  else {
    if (pbVar7->index != 2) goto LAB_0015f49b;
    pVVar1 = gen_ctx->temp_bitmap;
    if ((pVVar1 == (bitmap_t)0x0) || (pVVar1->varr == (bitmap_el_t *)0x0)) goto LAB_0015f491;
    pVVar1->els_num = 0;
    pVVar2 = gen_ctx->data_flow_ctx->worklist;
    if ((pVVar2 != (VARR_bb_t *)0x0) && (ppbVar5 = pVVar2->varr, ppbVar5 != (bb_t_conflict *)0x0)) {
      pVVar2->els_num = 0;
      if (pVVar2->size == 0) {
        pcStack_30 = (code *)0x15f1d9;
        ppbVar5 = (bb_t_conflict *)realloc(ppbVar5,8);
        pVVar2->varr = ppbVar5;
        pVVar2->size = 1;
        sVar10 = pVVar2->els_num;
        sVar12 = pbVar7->index;
        sVar8 = sVar10 + 1;
      }
      else {
        sVar8 = 1;
        sVar12 = 2;
        sVar10 = 0;
      }
      pVVar2->els_num = sVar8;
      ppbVar5[sVar10] = pbVar7;
      pbVar11 = (bb_t_conflict)gen_ctx->temp_bitmap;
      pcStack_30 = (code *)0x15f207;
      bb = pbVar11;
      bitmap_expand((bitmap_t)pbVar11,sVar12 + 1);
      if (pbVar11 != (bb_t_conflict)0x0) {
        ((bitmap_el_t *)pbVar11->rpost)[sVar12 >> 6] =
             ((bitmap_el_t *)pbVar11->rpost)[sVar12 >> 6] | 1L << (sVar12 & 0x3f);
        pbVar7 = (gen_ctx->curr_cfg->bbs).head;
        if (pbVar7 == (bb_t_conflict)0x0) {
LAB_0015f2fe:
          do {
            pVVar2 = gen_ctx->data_flow_ctx->worklist;
            do {
              if (pVVar2 == (VARR_bb_t *)0x0) goto LAB_0015f478;
              sVar8 = pVVar2->els_num;
              if (sVar8 == 0) {
                pbVar11 = (gen_ctx->curr_cfg->bbs).head;
                goto LAB_0015f3f4;
              }
              if (pVVar2->varr == (bb_t_conflict *)0x0) goto LAB_0015f47d;
              pVVar2->els_num = sVar8 - 1;
              peVar14 = (pVVar2->varr[sVar8 - 1]->out_edges).head;
            } while (peVar14 == (out_edge_t)0x0);
            do {
              pVVar1 = gen_ctx->temp_bitmap;
              uVar9 = peVar14->dst->index;
              pcStack_30 = (code *)0x15f357;
              bitmap_expand(pVVar1,uVar9 + 1);
              if (pVVar1 == (bitmap_t)0x0) {
                pcStack_30 = (code *)0x15f473;
                remove_unreachable_bbs_cold_4();
LAB_0015f473:
                pcStack_30 = (code *)0x15f478;
                remove_unreachable_bbs_cold_3();
LAB_0015f478:
                pcStack_30 = (code *)0x15f47d;
                remove_unreachable_bbs_cold_6();
LAB_0015f47d:
                pcStack_30 = (code *)0x15f482;
                remove_unreachable_bbs_cold_5();
                goto LAB_0015f482;
              }
              uVar3 = pVVar1->varr[uVar9 >> 6];
              pVVar1->varr[uVar9 >> 6] = uVar3 | 1L << (uVar9 & 0x3f);
              if ((uVar3 >> (uVar9 & 0x3f) & 1) == 0) {
                pVVar2 = gen_ctx->data_flow_ctx->worklist;
                ppbVar5 = pVVar2->varr;
                if (ppbVar5 == (bb_t_conflict *)0x0) goto LAB_0015f473;
                sVar8 = pVVar2->els_num;
                pbVar7 = peVar14->dst;
                uVar9 = sVar8 + 1;
                if (pVVar2->size < uVar9) {
                  sVar8 = (uVar9 >> 1) + uVar9;
                  pcStack_30 = (code *)0x15f3c1;
                  ppbVar5 = (bb_t_conflict *)realloc(ppbVar5,sVar8 * 8);
                  pVVar2->varr = ppbVar5;
                  pVVar2->size = sVar8;
                  sVar8 = pVVar2->els_num;
                  uVar9 = sVar8 + 1;
                }
                pVVar2->els_num = uVar9;
                ppbVar5[sVar8] = pbVar7;
              }
              peVar14 = (peVar14->out_link).next;
            } while (peVar14 != (out_edge_t)0x0);
          } while( true );
        }
        iVar4 = -1;
        do {
          pbVar7 = (pbVar7->bb_link).next;
          if (pbVar7 == (bb_t)0x0) break;
          bVar15 = iVar4 != 0;
          iVar4 = iVar4 + 1;
        } while (bVar15);
        do {
          if (pbVar7 == (bb_t)0x0) goto LAB_0015f2fe;
          if (pbVar7->reachable_p != '\0') {
            pVVar2 = gen_ctx->data_flow_ctx->worklist;
            ppbVar5 = pVVar2->varr;
            if (ppbVar5 == (bb_t_conflict *)0x0) goto LAB_0015f487;
            sVar8 = pVVar2->els_num;
            uVar9 = sVar8 + 1;
            if (pVVar2->size < uVar9) {
              sVar8 = (uVar9 >> 1) + uVar9;
              pcStack_30 = (code *)0x15f2ab;
              ppbVar5 = (bb_t_conflict *)realloc(ppbVar5,sVar8 * 8);
              pVVar2->varr = ppbVar5;
              pVVar2->size = sVar8;
              sVar8 = pVVar2->els_num;
              uVar9 = sVar8 + 1;
            }
            pVVar2->els_num = uVar9;
            ppbVar5[sVar8] = pbVar7;
            uVar9 = pbVar7->index;
            pVVar1 = gen_ctx->temp_bitmap;
            pcStack_30 = (code *)0x15f2d4;
            bitmap_expand(pVVar1,uVar9 + 1);
            if (pVVar1 == (bitmap_t)0x0) goto LAB_0015f48c;
            pVVar1->varr[uVar9 >> 6] = pVVar1->varr[uVar9 >> 6] | 1L << (uVar9 & 0x3f);
          }
          pbVar7 = (pbVar7->bb_link).next;
        } while( true );
      }
      pcStack_30 = enumerate_bbs;
      remove_unreachable_bbs_cold_7();
      pbVar7 = bb;
      if (bb != (bb_t_conflict)0x0) {
        do {
          pbVar7->pre = 0;
          pbVar7->rpost = 0;
          pbVar7 = (pbVar7->bb_link).next;
        } while (pbVar7 != (bb_t)0x0);
        if (bb != (bb_t_conflict)0x0) {
          pcStack_30 = (code *)0x0;
          pbVar7 = bb;
          do {
            pbVar7 = (pbVar7->bb_link).next;
            pcStack_30 = pcStack_30 + 1;
          } while (pbVar7 != (bb_t)0x0);
          goto LAB_0015f509;
        }
      }
      pcStack_30 = (code *)0x0;
LAB_0015f509:
      sStack_38 = 1;
      DFS(bb,&sStack_38,(size_t *)&pcStack_30);
      return extraout_RAX;
    }
  }
  pcStack_30 = (code *)0x15f49b;
  remove_unreachable_bbs_cold_8();
LAB_0015f49b:
  pcStack_30 = (code *)0x15f4ba;
  __assert_fail("bb->index == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1063,"void mark_unreachable_bbs(gen_ctx_t)");
}

Assistant:

static void mark_unreachable_bbs (gen_ctx_t gen_ctx) {
  bb_t bb = DLIST_EL (bb_t, curr_cfg->bbs, 2);

  if (bb == NULL) return;
  gen_assert (bb->index == 2);
  bitmap_clear (temp_bitmap);
  VARR_TRUNC (bb_t, worklist, 0);
  VARR_PUSH (bb_t, worklist, bb);
  bitmap_set_bit_p (temp_bitmap, bb->index);
  for (bb = DLIST_EL (bb_t, curr_cfg->bbs, 2); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    if (bb->reachable_p) {
      VARR_PUSH (bb_t, worklist, bb);
      bitmap_set_bit_p (temp_bitmap, bb->index);
    }
  while (VARR_LENGTH (bb_t, worklist) != 0) {
    bb = VARR_POP (bb_t, worklist);
    for (edge_t e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL;
         e = DLIST_NEXT (out_edge_t, e))
      if (bitmap_set_bit_p (temp_bitmap, e->dst->index)) VARR_PUSH (bb_t, worklist, e->dst);
  }
}